

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O0

void __thiscall
Jinx::Allocator<Jinx::Impl::Opcode>::deallocate
          (Allocator<Jinx::Impl::Opcode> *this,void *ptr,size_t n)

{
  size_t n_local;
  void *ptr_local;
  Allocator<Jinx::Impl::Opcode> *this_local;
  
  MemFree(ptr,n << 2);
  return;
}

Assistant:

void deallocate(void* ptr, size_t n) { Jinx::MemFree(static_cast<T*> (ptr), n * sizeof(value_type)); }